

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRr.c
# Opt level: O2

int Abc_NtkRR(Abc_Ntk_t *pNtk,int nFaninLevels,int nFanoutLevels,int fUseFanouts,int fVerbose)

{
  int *piVar1;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  Abc_Obj_t *pAVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  abctime aVar9;
  Abc_RRMan_t *p;
  Vec_Ptr_t *pVVar10;
  Prove_Params_t *pParams;
  Abc_Obj_t *pAVar11;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar12;
  ProgressBar *p_00;
  abctime aVar13;
  abctime aVar14;
  anon_union_8_2_00a17ec8_for_Abc_Obj_t__15 aVar15;
  long lVar16;
  long lVar17;
  int iVar18;
  char *__assertion;
  int i;
  
  aVar9 = Abc_Clock();
  p = (Abc_RRMan_t *)calloc(1,0xa0);
  pVVar10 = Vec_PtrAlloc(100);
  p->vFaninLeaves = pVVar10;
  pVVar10 = Vec_PtrAlloc(100);
  p->vFanoutRoots = pVVar10;
  pVVar10 = Vec_PtrAlloc(100);
  p->vLeaves = pVVar10;
  pVVar10 = Vec_PtrAlloc(100);
  p->vCone = pVVar10;
  pVVar10 = Vec_PtrAlloc(100);
  p->vRoots = pVVar10;
  pParams = (Prove_Params_t *)calloc(1,0x58);
  p->pParams = pParams;
  Prove_ParamsSetDefault(pParams);
  p->pNtk = pNtk;
  p->nFaninLevels = nFaninLevels;
  p->nFanoutLevels = nFanoutLevels;
  p->nNodesOld = pNtk->nObjCounts[7];
  iVar5 = Abc_AigLevel(pNtk);
  p->nLevelsOld = iVar5;
  Abc_NtkCleanCopy(pNtk);
  iVar5 = pNtk->vObjs->nSize;
  pAVar11 = Abc_AigConst1(pNtk);
  pAVar11->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)0xffffffff;
  for (iVar18 = 0; iVar18 < pNtk->vCis->nSize; iVar18 = iVar18 + 1) {
    pAVar11 = Abc_NtkCi(pNtk,iVar18);
    iVar6 = rand();
    iVar7 = rand();
    uVar8 = rand();
    aVar12._0_4_ = uVar8 ^ iVar7 << 0xc ^ iVar6 << 0x18;
    aVar12._4_4_ = 0;
    pAVar11->field_5 = aVar12;
  }
  for (iVar18 = 0; iVar18 < pNtk->vObjs->nSize; iVar18 = iVar18 + 1) {
    pAVar11 = Abc_NtkObj(pNtk,iVar18);
    if ((pAVar11 != (Abc_Obj_t *)0x0) &&
       (uVar8 = *(uint *)&pAVar11->field_0x14, iVar18 != 0 && (uVar8 & 0xf) == 7)) {
      if ((pAVar11->field_5).pData != (void *)0x0) {
        __assert_fail("pObj->pData == NULL",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRr.c"
                      ,0x2e8,"void Abc_NtkRRSimulateStart(Abc_Ntk_t *)");
      }
      piVar1 = (pAVar11->vFanins).pArray;
      ppvVar2 = pAVar11->pNtk->vObjs->pArray;
      aVar15._0_4_ = ((int)(uVar8 << 0x14) >> 0x1f ^ *(uint *)((long)ppvVar2[piVar1[1]] + 0x38)) &
                     ((int)(uVar8 << 0x15) >> 0x1f ^ *(uint *)((long)ppvVar2[*piVar1] + 0x38));
      aVar15._4_4_ = 0;
      pAVar11->field_5 = aVar15;
    }
  }
  p_00 = Extra_ProgressBarStart(_stdout,iVar5);
  for (iVar18 = 0; iVar18 < pNtk->vObjs->nSize; iVar18 = iVar18 + 1) {
    pAVar11 = Abc_NtkObj(pNtk,iVar18);
    if ((pAVar11 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar11->field_0x14 & 0xf) == 7)) {
      if ((p_00 == (ProgressBar *)0x0) || (p_00->nItemsNext <= iVar18)) {
        Extra_ProgressBarUpdate_int(p_00,iVar18,(char *)0x0);
      }
      if (iVar5 <= iVar18) break;
      if (((ulong)pAVar11 & 1) != 0) {
        __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_0026e113:
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x18e,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
      }
      if (pAVar11->pNtk->ntkType != ABC_NTK_STRASH) {
        __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
        goto LAB_0026e113;
      }
      if ((pAVar11->vFanins).nSize != 2) {
        __assert_fail("Abc_AigNodeIsAnd(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                      ,0x192,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
      }
      if (((pAVar11->field_0x15 & 2) == 0) && ((pAVar11->vFanouts).nSize < 0x3e9)) {
        iVar6 = 2;
        if (fUseFanouts == 0) {
          for (lVar16 = 0; lVar16 < iVar6; lVar16 = lVar16 + 1) {
            pAVar3 = (Abc_Obj_t *)pAVar11->pNtk->vObjs->pArray[(pAVar11->vFanins).pArray[lVar16]];
            if ((pAVar3->vFanouts).nSize != 1) {
              p->nEdgesTried = p->nEdgesTried + 1;
              Abc_RRManClean(p);
              p->pNode = pAVar11;
              p->pFanin = pAVar3;
              p->pFanout = (Abc_Obj_t *)0x0;
              aVar13 = Abc_Clock();
              iVar6 = Abc_NtkRRWindow(p);
              aVar14 = Abc_Clock();
              p->timeWindow = p->timeWindow + (aVar14 - aVar13);
              if (iVar6 != 0) {
                aVar13 = Abc_Clock();
                iVar6 = Abc_NtkRRProve(p);
                aVar14 = Abc_Clock();
                p->timeMiter = p->timeMiter + (aVar14 - aVar13);
                if (iVar6 != 0) {
                  aVar13 = Abc_Clock();
                  Abc_NtkRRUpdate(pNtk,p->pNode,p->pFanin,p->pFanout);
                  aVar14 = Abc_Clock();
                  p->timeUpdate = p->timeUpdate + (aVar14 - aVar13);
                  p->nEdgesRemoved = p->nEdgesRemoved + 1;
                  break;
                }
              }
            }
            iVar6 = (pAVar11->vFanins).nSize;
          }
        }
        else {
          for (lVar16 = 0; lVar16 < iVar6; lVar16 = lVar16 + 1) {
            pAVar3 = (Abc_Obj_t *)pAVar11->pNtk->vObjs->pArray[(pAVar11->vFanins).pArray[lVar16]];
            for (lVar17 = 0; lVar17 < (pAVar11->vFanouts).nSize; lVar17 = lVar17 + 1) {
              pAVar4 = (Abc_Obj_t *)pAVar11->pNtk->vObjs->pArray[(pAVar11->vFanouts).pArray[lVar17]]
              ;
              p->nEdgesTried = p->nEdgesTried + 1;
              Abc_RRManClean(p);
              p->pNode = pAVar11;
              p->pFanin = pAVar3;
              p->pFanout = pAVar4;
              aVar13 = Abc_Clock();
              iVar6 = Abc_NtkRRWindow(p);
              aVar14 = Abc_Clock();
              p->timeWindow = p->timeWindow + (aVar14 - aVar13);
              if (iVar6 != 0) {
                aVar13 = Abc_Clock();
                iVar6 = Abc_NtkRRProve(p);
                aVar14 = Abc_Clock();
                p->timeMiter = p->timeMiter + (aVar14 - aVar13);
                if (iVar6 != 0) {
                  aVar13 = Abc_Clock();
                  Abc_NtkRRUpdate(pNtk,p->pNode,p->pFanin,p->pFanout);
                  aVar14 = Abc_Clock();
                  p->timeUpdate = p->timeUpdate + (aVar14 - aVar13);
                  p->nEdgesRemoved = p->nEdgesRemoved + 1;
                  break;
                }
              }
            }
            iVar6 = (pAVar11->vFanins).nSize;
          }
        }
      }
    }
  }
  for (iVar5 = 0; iVar5 < pNtk->vObjs->nSize; iVar5 = iVar5 + 1) {
    pAVar11 = Abc_NtkObj(pNtk,iVar5);
    if (pAVar11 != (Abc_Obj_t *)0x0) {
      (pAVar11->field_5).pData = (void *)0x0;
    }
  }
  Extra_ProgressBarStop(p_00);
  aVar13 = Abc_Clock();
  p->timeTotal = aVar13 - aVar9;
  if (fVerbose != 0) {
    iVar5 = p->nNodesOld;
    iVar18 = p->pNtk->nObjCounts[7];
    puts("Redundancy removal statistics:");
    printf("Edges tried     = %6d.\n",(ulong)(uint)p->nEdgesTried);
    printf("Edges removed   = %6d. (%5.2f %%)\n",
           ((double)p->nEdgesRemoved * 100.0) / (double)p->nEdgesTried);
    printf("Node gain       = %6d. (%5.2f %%)\n",((double)(iVar5 - iVar18) * 100.0) / (double)iVar5,
           (ulong)(uint)(p->nNodesOld - p->pNtk->nObjCounts[7]));
    iVar5 = p->nLevelsOld;
    iVar18 = Abc_AigLevel(p->pNtk);
    iVar6 = 0x6b5d91;
    printf("Level gain      = %6d.\n",(ulong)(uint)(iVar5 - iVar18));
    Abc_Print(iVar6,"%s =","Windowing      ");
    Abc_Print(iVar6,"%9.2f sec\n",(double)p->timeWindow / 1000000.0);
    Abc_Print(iVar6,"%s =","Miter          ");
    Abc_Print(iVar6,"%9.2f sec\n",(double)p->timeMiter / 1000000.0);
    Abc_Print(iVar6,"%s =","    Construct  ");
    Abc_Print(iVar6,"%9.2f sec\n",(double)(p->timeMiter - p->timeProve) / 1000000.0);
    Abc_Print(iVar6,"%s =","    Prove      ");
    Abc_Print(iVar6,"%9.2f sec\n",(double)p->timeProve / 1000000.0);
    Abc_Print(iVar6,"%s =","Update         ");
    Abc_Print(iVar6,"%9.2f sec\n",(double)p->timeUpdate / 1000000.0);
    Abc_Print(iVar6,"%s =","TOTAL          ");
    Abc_Print(iVar6,"%9.2f sec\n",(double)p->timeTotal / 1000000.0);
  }
  Abc_RRManClean(p);
  Vec_PtrFree(p->vFaninLeaves);
  Vec_PtrFree(p->vFanoutRoots);
  Vec_PtrFree(p->vLeaves);
  Vec_PtrFree(p->vCone);
  Vec_PtrFree(p->vRoots);
  free(p->pParams);
  free(p);
  Abc_NtkReassignIds(pNtk);
  Abc_NtkLevel(pNtk);
  iVar5 = Abc_NtkCheck(pNtk);
  if (iVar5 == 0) {
    puts("Abc_NtkRR: The network check has failed.");
  }
  return (uint)(iVar5 != 0);
}

Assistant:

int Abc_NtkRR( Abc_Ntk_t * pNtk, int nFaninLevels, int nFanoutLevels, int fUseFanouts, int fVerbose )
{
    ProgressBar * pProgress;
    Abc_RRMan_t * p;
    Abc_Obj_t * pNode, * pFanin, * pFanout;
    int i, k, m, nNodes, RetValue;
    abctime clk, clkTotal = Abc_Clock();
    // start the manager
    p = Abc_RRManStart();
    p->pNtk          = pNtk;
    p->nFaninLevels  = nFaninLevels;
    p->nFanoutLevels = nFanoutLevels;
    p->nNodesOld     = Abc_NtkNodeNum(pNtk);
    p->nLevelsOld    = Abc_AigLevel(pNtk);
    // remember latch values
//    Abc_NtkForEachLatch( pNtk, pNode, i )
//        pNode->pNext = pNode->pData;
    // go through the nodes
    Abc_NtkCleanCopy(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    Abc_NtkRRSimulateStart(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // construct the window
        if ( !fUseFanouts )
        {
            Abc_ObjForEachFanin( pNode, pFanin, k )
            {
                // skip the nodes with only one fanout (tree nodes)
                if ( Abc_ObjFanoutNum(pFanin) == 1 )
                    continue;
/*
                if ( pFanin->Id == 228 && pNode->Id == 2649 )
                {
                    int k = 0;
                }
*/
                p->nEdgesTried++;
                Abc_RRManClean( p );
                p->pNode   = pNode;
                p->pFanin  = pFanin;
                p->pFanout = NULL;

                clk = Abc_Clock();
                RetValue = Abc_NtkRRWindow( p );
                p->timeWindow += Abc_Clock() - clk;
                if ( !RetValue )
                    continue;
/*
                if ( pFanin->Id == 228 && pNode->Id == 2649 )
                {
                    Abc_NtkShowAig( p->pWnd, 0 );
                }
*/
                clk = Abc_Clock();
                RetValue = Abc_NtkRRProve( p );
                p->timeMiter += Abc_Clock() - clk;
                if ( !RetValue )
                    continue;
//printf( "%d -> %d (%d)\n", pFanin->Id, pNode->Id, k );

                clk = Abc_Clock();
                Abc_NtkRRUpdate( pNtk, p->pNode, p->pFanin, p->pFanout );
                p->timeUpdate += Abc_Clock() - clk;

                p->nEdgesRemoved++;
                break;
            }
            continue;
        }
        // use the fanouts
        Abc_ObjForEachFanin( pNode, pFanin, k )
        Abc_ObjForEachFanout( pNode, pFanout, m )
        {
            // skip the nodes with only one fanout (tree nodes)
//            if ( Abc_ObjFanoutNum(pFanin) == 1 && Abc_ObjFanoutNum(pNode) == 1 )
//                continue;

            p->nEdgesTried++;
            Abc_RRManClean( p );
            p->pNode   = pNode;
            p->pFanin  = pFanin;
            p->pFanout = pFanout;

            clk = Abc_Clock();
            RetValue = Abc_NtkRRWindow( p );
            p->timeWindow += Abc_Clock() - clk;
            if ( !RetValue )
                continue;

            clk = Abc_Clock();
            RetValue = Abc_NtkRRProve( p );
            p->timeMiter += Abc_Clock() - clk;
            if ( !RetValue )
                continue;

            clk = Abc_Clock();
            Abc_NtkRRUpdate( pNtk, p->pNode, p->pFanin, p->pFanout );
            p->timeUpdate += Abc_Clock() - clk;

            p->nEdgesRemoved++;
            break;
        }
    }
    Abc_NtkRRSimulateStop(pNtk);
    Extra_ProgressBarStop( pProgress );
    p->timeTotal = Abc_Clock() - clkTotal;
    if ( fVerbose )
        Abc_RRManPrintStats( p );
    Abc_RRManStop( p );
    // restore latch values
//    Abc_NtkForEachLatch( pNtk, pNode, i )
//        pNode->pData = pNode->pNext, pNode->pNext = NULL;
    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
    Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRR: The network check has failed.\n" );
        return 0;
    }
    return 1;
}